

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDarLcorrNew(Abc_Ntk_t *pNtk,int nVarsMax,int nConfMax,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pLatch;
  int i;
  Ssw_Pars_t Pars;
  
  pNtk_00 = (Abc_Ntk_t *)0x0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    Ssw_ManSetDefaultParams(&Pars);
    Pars.fLatchCorrOpt = 1;
    Pars.nBTLimit = nConfMax;
    Pars.fVerbose = fVerbose;
    Pars.nSatVarMax = nVarsMax;
    pMan = Ssw_SignalCorrespondence(pAig,&Pars);
    Aig_ManStop(pAig);
    if (pMan == (Aig_Man_t *)0x0) {
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pMan->nRegs < pNtk->nObjCounts[8]) {
        pNtk_00 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
      }
      else {
        pNtk_00 = Abc_NtkFromDar(pNtk,pMan);
        for (i = 0; i < pNtk_00->vBoxes->nSize; i = i + 1) {
          pLatch = Abc_NtkBox(pNtk_00,i);
          if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
            Abc_LatchSetInit0(pLatch);
          }
        }
      }
      Aig_ManStop(pMan);
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLcorrNew( Abc_Ntk_t * pNtk, int nVarsMax, int nConfMax, int fVerbose )
{
    Ssw_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    Ssw_ManSetDefaultParams( pPars );
    pPars->fLatchCorrOpt = 1;
    pPars->nBTLimit      = nConfMax;
    pPars->nSatVarMax    = nVarsMax;
    pPars->fVerbose      = fVerbose;
    pMan = Ssw_SignalCorrespondence( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}